

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svm_helper.c
# Opt level: O1

void svm_load_seg_cache(CPUX86State *env,hwaddr addr,int seg_reg)

{
  CPUState *cs;
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint64_t uVar4;
  uint uVar5;
  uint uVar6;
  CPUX86State *__mptr;
  
  cs = (CPUState *)(env[-6].mtrr_var + 4);
  uVar1 = x86_lduw_phys_x86_64(cs,addr);
  uVar4 = x86_ldq_phys_x86_64(cs,addr + 8);
  uVar2 = x86_ldl_phys_x86_64(cs,addr + 4);
  uVar3 = x86_lduw_phys_x86_64(cs,addr + 2);
  env->segs[(uint)seg_reg].selector = uVar1;
  env->segs[(uint)seg_reg].base = uVar4;
  env->segs[(uint)seg_reg].limit = uVar2;
  env->segs[(uint)seg_reg].flags = (uVar3 & 0xf00) << 0xc | uVar3 << 8 & 0xffff;
  if (seg_reg == 2) {
    env->hflags = env->hflags & 0xfffffffc | (uVar3 << 8) >> 0xd & 3;
    cpu_sync_bndcs_hflags_x86_64(env);
  }
  else if (seg_reg == 1) {
    uVar6 = env->hflags;
    if ((uVar3 >> 9 & 1) == 0 || (uVar6 >> 0xe & 1) == 0) {
      uVar6 = uVar6 & 0xffff7fef | env->segs[1].flags >> 0x12 & 0x10;
    }
    else {
      uVar6 = uVar6 & 0xffff7f8f | 0x8030;
    }
    env->hflags = uVar6;
  }
  uVar6 = env->hflags;
  uVar5 = env->segs[2].flags >> 0x11 & 0x20;
  if (-1 < (short)uVar6) {
    if ((((env->cr[0] & 1) == 0) || ((uVar6 & 0x10) == 0)) || ((env->eflags & 0x20000) != 0)) {
      uVar5 = uVar5 | 0x40;
    }
    else {
      uVar5 = uVar5 | (uint)((env->segs[0].base != 0 || env->segs[3].base != 0) ||
                            env->segs[2].base != 0) << 6;
    }
  }
  env->hflags = uVar6 & 0xffffff9f | uVar5;
  return;
}

Assistant:

static inline void svm_load_seg_cache(CPUX86State *env, hwaddr addr,
                                      int seg_reg)
{
    SegmentCache sc1, *sc = &sc1;

    svm_load_seg(env, addr, sc);
    cpu_x86_load_seg_cache(env, seg_reg, sc->selector,
                           sc->base, sc->limit, sc->flags);
}